

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O1

array<float,_4> __thiscall pbrt::HairBxDF::ComputeApPDF(HairBxDF *this,Float cosTheta_o)

{
  undefined8 uVar1;
  bool bVar2;
  SampledSpectrum SVar3;
  SampledSpectrum *pSVar4;
  int i_1;
  long lVar5;
  int i_3;
  int i;
  long lVar6;
  undefined1 auVar7 [16];
  float fVar8;
  float fVar9;
  undefined1 in_register_00001204 [60];
  undefined1 auVar10 [64];
  undefined1 auVar11 [16];
  float fVar12;
  array<float,_4> aVar13;
  array<float,_4> apPDF;
  array<pbrt::SampledSpectrum,_4> ap;
  SampledSpectrum T;
  undefined8 local_88;
  undefined8 uStack_80;
  float local_78 [4];
  SampledSpectrum local_68 [4];
  SampledSpectrum local_20;
  
  auVar10._4_60_ = in_register_00001204;
  auVar10._0_4_ = cosTheta_o;
  auVar7 = vfnmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),auVar10._0_16_,auVar10._0_16_);
  auVar11 = ZEXT816(0) << 0x40;
  auVar7 = vmaxss_avx(auVar7,auVar11);
  if (auVar7._0_4_ < 0.0) {
    fVar12 = sqrtf(auVar7._0_4_);
    auVar11 = ZEXT816(0) << 0x40;
  }
  else {
    auVar7 = vsqrtss_avx(auVar7,auVar7);
    fVar12 = auVar7._0_4_;
  }
  fVar8 = fVar12 / this->eta;
  auVar7 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar8 * fVar8)),auVar11);
  if (auVar7._0_4_ < 0.0) {
    fVar8 = sqrtf(auVar7._0_4_);
  }
  else {
    auVar7 = vsqrtss_avx(auVar7,auVar7);
    fVar8 = auVar7._0_4_;
  }
  auVar7 = vfmsub231ss_fma(ZEXT416((uint)(fVar12 * fVar12)),ZEXT416((uint)this->eta),
                           ZEXT416((uint)this->eta));
  auVar11 = ZEXT816(0) << 0x40;
  auVar7 = vmaxss_avx(auVar7,auVar11);
  if (auVar7._0_4_ < 0.0) {
    fVar12 = sqrtf(auVar7._0_4_);
    auVar11 = ZEXT816(0) << 0x40;
  }
  else {
    auVar7 = vsqrtss_avx(auVar7,auVar7);
    fVar12 = auVar7._0_4_;
  }
  fVar12 = this->h / (fVar12 / cosTheta_o);
  auVar7 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar12 * fVar12)),auVar11);
  if (auVar7._0_4_ < 0.0) {
    fVar9 = sqrtf(auVar7._0_4_);
  }
  else {
    auVar7 = vsqrtss_avx(auVar7,auVar7);
    fVar9 = auVar7._0_4_;
  }
  auVar7 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)fVar12));
  uVar1 = vcmpss_avx512f(ZEXT416((uint)fVar12),SUB6416(ZEXT464(0xbf800000),0),1);
  bVar2 = (bool)((byte)uVar1 & 1);
  asinf((float)((uint)bVar2 * -0x40800000 + (uint)!bVar2 * auVar7._0_4_));
  auVar7._8_4_ = 0x80000000;
  auVar7._0_8_ = 0x8000000080000000;
  auVar7._12_4_ = 0x80000000;
  auVar7 = vxorps_avx512vl(*(undefined1 (*) [16])(this->sigma_a).values.values,auVar7);
  fVar8 = (fVar9 + fVar9) / fVar8;
  local_78[0] = fVar8 * auVar7._0_4_;
  local_78[1] = fVar8 * auVar7._4_4_;
  local_78[2] = fVar8 * auVar7._8_4_;
  local_78[3] = fVar8 * auVar7._12_4_;
  local_68[0].values.values = (array<float,_4>)(array<float,_4>)(ZEXT416(0) << 0x20);
  lVar6 = 0;
  do {
    fVar12 = expf(local_78[lVar6]);
    local_68[0].values.values[lVar6] = fVar12;
    SVar3.values.values = local_68[0].values.values;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 4);
  pSVar4 = local_68;
  local_20.values.values[0] = local_68[0].values.values[0];
  local_20.values.values[1] = local_68[0].values.values[1];
  local_20.values.values[2] = local_68[0].values.values[2];
  local_20.values.values[3] = local_68[0].values.values[3];
  local_68[0].values.values = SVar3.values.values;
  Ap((array<pbrt::SampledSpectrum,_4> *)pSVar4,cosTheta_o,this->eta,this->h,&local_20);
  local_88 = 0;
  uStack_80 = 0;
  fVar12 = 0.0;
  lVar6 = 0;
  do {
    fVar8 = *(float *)((long)local_68[0].values.values + lVar6);
    lVar5 = 1;
    do {
      fVar8 = fVar8 + (((SampledSpectrum *)&pSVar4->values)->values).values[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    fVar12 = fVar12 + fVar8 * 0.25;
    lVar6 = lVar6 + 0x10;
    pSVar4 = pSVar4 + 1;
  } while (lVar6 != 0x40);
  pSVar4 = local_68;
  lVar6 = 0;
  do {
    fVar8 = local_68[lVar6].values.values[0];
    lVar5 = 1;
    do {
      fVar8 = fVar8 + (pSVar4->values).values[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    *(float *)((long)&local_88 + lVar6 * 4) = (fVar8 * 0.25) / fVar12;
    lVar6 = lVar6 + 1;
    pSVar4 = pSVar4 + 1;
  } while (lVar6 != 4);
  aVar13.values[0] = (float)(undefined4)local_88;
  aVar13.values[1] = (float)local_88._4_4_;
  aVar13.values[2] = (float)(undefined4)uStack_80;
  aVar13.values[3] = (float)uStack_80._4_4_;
  return (array<float,_4>)aVar13.values;
}

Assistant:

pstd::array<Float, HairBxDF::pMax + 1> HairBxDF::ComputeApPDF(Float cosTheta_o) const {
    // Compute array of $A_p$ values for _cosThetaO_
    Float sinTheta_o = SafeSqrt(1 - cosTheta_o * cosTheta_o);
    // Compute $\cos \thetat$ for refracted ray
    Float sinTheta_t = sinTheta_o / eta;
    Float cosTheta_t = SafeSqrt(1 - Sqr(sinTheta_t));

    // Compute $\gammat$ for refracted ray
    Float etap = SafeSqrt(eta * eta - Sqr(sinTheta_o)) / cosTheta_o;
    Float sinGamma_t = h / etap;
    Float cosGamma_t = SafeSqrt(1 - Sqr(sinGamma_t));
    Float gamma_t = SafeASin(sinGamma_t);

    // Compute the transmittance _T_ of a single path through the cylinder
    SampledSpectrum T = Exp(-sigma_a * (2 * cosGamma_t / cosTheta_t));

    pstd::array<SampledSpectrum, pMax + 1> ap = Ap(cosTheta_o, eta, h, T);

    // Compute $A_p$ PDF from individual $A_p$ terms
    pstd::array<Float, pMax + 1> apPDF;
    Float sumY = 0;
    for (const SampledSpectrum &as : ap)
        sumY += as.Average();
    for (int i = 0; i <= pMax; ++i)
        apPDF[i] = ap[i].Average() / sumY;

    return apPDF;
}